

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O3

void attach_fig_transform_timeout(obj *figurine)

{
  uint uVar1;
  
  stop_timer(figurine->olev,5,figurine);
  uVar1 = mt_random();
  start_timer(figurine->olev,(ulong)(uVar1 % 9000 + 0xc9),2,5,figurine);
  return;
}

Assistant:

void attach_fig_transform_timeout(struct obj *figurine)
{
	int i;

	/* stop previous timer, if any */
	stop_timer(figurine->olev, FIG_TRANSFORM, figurine);

	/*
	 * Decide when to transform the figurine.
	 */
	i = rnd(9000) + 200;
	/* figurine will transform */
	start_timer(figurine->olev, (long)i, TIMER_OBJECT,
				FIG_TRANSFORM, figurine);
}